

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_digest.cc
# Opt level: O1

int ASN1_digest(undefined1 *i2d,EVP_MD *type,char *data,uchar *md,uint *len)

{
  int iVar1;
  int iVar2;
  void *data_00;
  uchar *p;
  
  iVar2 = 0;
  iVar1 = (*(code *)i2d)(data,0);
  data_00 = OPENSSL_malloc((long)iVar1);
  if (data_00 != (void *)0x0) {
    (*(code *)i2d)(data);
    iVar2 = EVP_Digest(data_00,(long)iVar1,md,len,type,(ENGINE *)0x0);
    OPENSSL_free(data_00);
  }
  return iVar2;
}

Assistant:

int ASN1_digest(i2d_of_void *i2d, const EVP_MD *type, char *data,
                unsigned char *md, unsigned int *len) {
  int i, ret;
  unsigned char *str, *p;

  i = i2d(data, NULL);
  if ((str = (unsigned char *)OPENSSL_malloc(i)) == NULL) {
    return 0;
  }
  p = str;
  i2d(data, &p);

  ret = EVP_Digest(str, i, md, len, type, NULL);
  OPENSSL_free(str);
  return ret;
}